

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

bigint<13> * __thiscall bigint<13>::sub<13,1>(bigint<13> *this,bigint<13> *x,bigint<1> *y)

{
  uint local_3c;
  int local_28;
  uint local_24;
  int i;
  dbldigit borrow;
  bigint<1> *y_local;
  bigint<13> *x_local;
  bigint<13> *this_local;
  
  operator>=(x,y);
  local_24 = 0;
  for (local_28 = 0; local_28 < y->len || local_24 != 0; local_28 = local_28 + 1) {
    if (local_28 < y->len) {
      local_3c = (uint)y->digits[local_28];
    }
    else {
      local_3c = 0;
    }
    local_24 = ((x->digits[local_28] + 0x10000) - local_3c) - local_24;
    this->digits[local_28] = (digit)local_24;
    local_24 = local_24 >> 0x10 ^ 1;
  }
  if ((local_28 < x->len) && (this != x)) {
    memcpy(this->digits + local_28,x->digits + local_28,(long)(x->len - local_28) << 1);
  }
  this->len = x->len;
  shrink(this);
  return this;
}

Assistant:

bigint &sub(const bigint<X_DIGITS> &x, const bigint<Y_DIGITS> &y)
    {
        ASSERT(x >= y);
        dbldigit borrow = 0;
        int i;
        for(i = 0; i < y.len || borrow; i++)
        {
             borrow = (1<<BI_DIGIT_BITS) + (dbldigit)x.digits[i] - (i<y.len ? (dbldigit)y.digits[i] : 0) - borrow;
             digits[i] = (digit)borrow;
             borrow = (borrow>>BI_DIGIT_BITS)^1;
        }
        if(i < x.len && this != &x) memcpy(&digits[i], &x.digits[i], (x.len - i)*sizeof(digit));
        len = x.len;
        shrink();
        return *this;
    }